

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
argagg::option_result::as<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,option_result *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  if ((convert *)this->arg == (convert *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)t);
  }
  else {
    convert::arg<std::__cxx11::string>(__return_storage_ptr__,(convert *)this->arg,(char *)t);
  }
  return __return_storage_ptr__;
}

Assistant:

T option_result::as(const T& t) const
{
  if (this->arg) {
    try {
      return convert::arg<T>(this->arg);
    } catch (...) {
      return t;
    }
  } else {
    // I actually think this will never happen. To call this method you have
    // to access a specific option_result for an option. If there's a
    // specific option_result then the option was found. If the option
    // requires an argument then it will definitely have an argument
    // otherwise the parser would have complained.
    return t;
  }
}